

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# water.cpp
# Opt level: O1

shared_ptr<Image> runWaterEffect(Image *src,WaterEffectOptions *options)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  runtime_error *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  WaterEffectOptions *pWVar7;
  shared_ptr<Image> sVar8;
  WaterEffectOptions *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  src->pixels = (Pixel *)0x0;
  (src->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if ((char)in_RDX[2]._M_use_count == '\x01') {
    lVar3 = std::chrono::_V2::system_clock::now();
    runHistogramStage((Image *)&local_48,options);
    pWVar7 = local_48;
    local_38 = p_Stack_40;
    local_48 = (WaterEffectOptions *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar4 = std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Stage: Histogram:        ",0x19);
    poVar5 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) * 1e-09);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," s.",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    _Var6._M_pi = extraout_RDX;
  }
  else {
    pWVar7 = (WaterEffectOptions *)0x0;
    local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Var6._M_pi = in_RDX;
  }
  if (*(char *)((long)&in_RDX[2]._M_use_count + 1) == '\x01') {
    lVar3 = std::chrono::_V2::system_clock::now();
    if (pWVar7 == (WaterEffectOptions *)0x0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Cannot run enhance stage without histogram.");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    runEnhanceStage((Image *)&local_48,(Histogram *)options,pWVar7);
    p_Var2 = p_Stack_40;
    pWVar7 = local_48;
    local_48 = (WaterEffectOptions *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (src->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    src->pixels = (Pixel *)pWVar7;
    (src->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)p_Var2;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
    lVar4 = std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Stage: Contrast enhance: ",0x19);
    poVar5 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) * 1e-09);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," s.",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    _Var6._M_pi = extraout_RDX_00;
  }
  if (*(char *)((long)&in_RDX[2]._M_use_count + 3) == '\x01') {
    lVar3 = std::chrono::_V2::system_clock::now();
    if ((WaterEffectOptions *)src->pixels == (WaterEffectOptions *)0x0) {
      runRippleStage((Image *)&local_48,options);
    }
    else {
      runRippleStage((Image *)&local_48,(WaterEffectOptions *)src->pixels);
    }
    p_Var2 = p_Stack_40;
    pWVar7 = local_48;
    local_48 = (WaterEffectOptions *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (src->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    src->pixels = (Pixel *)pWVar7;
    (src->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)p_Var2;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
    lVar4 = std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Stage: Ripple effect:    ",0x19);
    poVar5 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) * 1e-09);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," s.",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    _Var6._M_pi = extraout_RDX_01;
  }
  if (*(char *)&in_RDX[2]._vptr__Sp_counted_base == '\x01') {
    lVar3 = std::chrono::_V2::system_clock::now();
    if ((WaterEffectOptions *)src->pixels == (WaterEffectOptions *)0x0) {
      runBlurStage((Image *)&local_48,options);
    }
    else {
      runBlurStage((Image *)&local_48,(WaterEffectOptions *)src->pixels);
    }
    p_Var2 = p_Stack_40;
    pWVar7 = local_48;
    local_48 = (WaterEffectOptions *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (src->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    src->pixels = (Pixel *)pWVar7;
    (src->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)p_Var2;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
    lVar4 = std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Stage: Blur:             ",0x19);
    poVar5 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) * 1e-09);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," s.",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    _Var6._M_pi = extraout_RDX_02;
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    _Var6._M_pi = extraout_RDX_03;
  }
  sVar8.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  sVar8.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = src;
  return (shared_ptr<Image>)sVar8.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Image> runWaterEffect(const Image *src, const WaterEffectOptions *options) {
  // Stage timer
  Timer ts;

  // Smart pointers to intermediate images:
  std::shared_ptr<Histogram> hist;
  std::shared_ptr<Image> img_result;

  // Histogram stage
  if (options->histogram) {
    ts.start();
    hist = runHistogramStage(src, options);
    ts.stop();
    std::cout << "Stage: Histogram:        " << ts.seconds() << " s." << std::endl;
  }

  // Contrast enhancement stage
  if (options->enhance) {
    ts.start();
    if (hist == nullptr) {
      throw std::runtime_error("Cannot run enhance stage without histogram.");
    }
    img_result = runEnhanceStage(src, hist.get(), options);
    ts.stop();
    std::cout << "Stage: Contrast enhance: " << ts.seconds() << " s." << std::endl;
  }

  // Ripple effect stage
  if (options->ripple) {
    ts.start();
    if (img_result == nullptr) {
      img_result = runRippleStage(src, options);
    } else {
      img_result = runRippleStage(img_result.get(), options);
    }
    ts.stop();
    std::cout << "Stage: Ripple effect:    " << ts.seconds() << " s." << std::endl;
  }

  // Gaussian blur stage
  if (options->blur) {
    ts.start();
    if (img_result == nullptr) {
      img_result = runBlurStage(src, options);
    } else {
      img_result = runBlurStage(img_result.get(), options);
    }
    ts.stop();
    std::cout << "Stage: Blur:             " << ts.seconds() << " s." << std::endl;
  }

  return img_result;
}